

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall node::BlockManager::FlushUndoFile(BlockManager *this,int block_file,bool finalize)

{
  Notifications *pNVar1;
  bool bVar2;
  long in_FS_OFFSET;
  FlatFilePos undo_pos_old;
  FlatFilePos local_80;
  char *local_78;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.nPos =
       (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
       _M_impl.super__Vector_impl_data._M_start[block_file].nUndoSize;
  local_80.nFile = block_file;
  bVar2 = FlatFileSeq::Flush(&this->m_undo_file_seq,&local_80,finalize);
  if (!bVar2) {
    pNVar1 = (this->m_opts).notifications;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,
               "Flushing undo file to disk failed. This is likely the result of an I/O error.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Flushing undo file to disk failed. This is likely the result of an I/O error.","")
      ;
    }
    else {
      local_78 = "Flushing undo file to disk failed. This is likely the result of an I/O error.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_50,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_78);
    }
    (*pNVar1->_vptr_Notifications[7])(pNVar1,local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::FlushUndoFile(int block_file, bool finalize)
{
    FlatFilePos undo_pos_old(block_file, m_blockfile_info[block_file].nUndoSize);
    if (!m_undo_file_seq.Flush(undo_pos_old, finalize)) {
        m_opts.notifications.flushError(_("Flushing undo file to disk failed. This is likely the result of an I/O error."));
        return false;
    }
    return true;
}